

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

void __thiscall
TestSuite::doTest<bool,int(*)(bool)>
          (TestSuite *this,string *test_name,_func_int_bool *func,TestRange<bool> *range)

{
  pointer pcVar1;
  int result;
  long lVar2;
  long *plVar3;
  string *psVar4;
  long *plVar5;
  size_t idx;
  size_t sVar6;
  bool bVar7;
  string actual_test_name;
  stringstream ss;
  long *local_240;
  long local_230;
  long lStack_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  _func_int_bool *local_200;
  string local_1f8;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = func;
  if (((this->filter)._M_string_length != 0) &&
     (lVar2 = std::__cxx11::string::find((char *)test_name,(ulong)(this->filter)._M_dataplus._M_p,0)
     , lVar2 == -1)) {
    return;
  }
  sVar6 = 1;
  if (this->useGivenRange == false) {
    sVar6 = TestRange<bool>::getSteps(range);
  }
  if (sVar6 != 0) {
    idx = 0;
    do {
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      pcVar1 = (test_name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,pcVar1,pcVar1 + test_name->_M_string_length);
      std::__cxx11::stringstream::stringstream(local_1b8);
      if (this->useGivenRange == true) {
        bVar7 = this->givenRange != 0;
      }
      else {
        bVar7 = TestRange<bool>::getEntry(range,idx);
      }
      std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
      std::__cxx11::stringbuf::str();
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x15ec7b);
      local_220 = &local_210;
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_210 = *plVar5;
        lStack_208 = plVar3[3];
      }
      else {
        local_210 = *plVar5;
        local_220 = (long *)*plVar3;
      }
      local_218 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_220);
      local_240 = &local_230;
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_230 = *plVar5;
        lStack_228 = plVar3[3];
      }
      else {
        local_230 = *plVar5;
        local_240 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_240);
      if (local_240 != &local_230) {
        operator_delete(local_240);
      }
      if (local_220 != &local_210) {
        operator_delete(local_220);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0]);
      }
      readyTest(this,&local_1f8);
      psVar4 = getResMsg_abi_cxx11_();
      std::__cxx11::string::_M_replace((ulong)psVar4,0,(char *)psVar4->_M_string_length,0x15eea9);
      psVar4 = getInfoMsg_abi_cxx11_();
      std::__cxx11::string::_M_replace((ulong)psVar4,0,(char *)psVar4->_M_string_length,0x15eea9);
      getCurTest()::cur_test = this;
      result = (*local_200)(bVar7);
      reportTestResult(this,&local_1f8,result);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      idx = idx + 1;
    } while (sVar6 != idx);
  }
  return;
}

Assistant:

void doTest( std::string test_name,
                 F func,
                 TestRange<T> range )
    {
        if (!matchFilter(test_name)) return;

        size_t n = (useGivenRange) ? 1 : range.getSteps();
        size_t i;

        for (i=0; i<n; ++i) {
            std::string actual_test_name = test_name;
            std::stringstream ss;


            T cur_arg = (useGivenRange)
                        ? givenRange
                        : range.getEntry(i);

            ss << cur_arg;
            actual_test_name += " (" + ss.str() + ")";
            readyTest(actual_test_name);

            TestSuite::getResMsg() = "";
            TestSuite::getInfoMsg() = "";
            TestSuite::getCurTest() = this;

            int ret = func(cur_arg);
            reportTestResult(actual_test_name, ret);
        }
    }